

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_move_to(FT_26D6_Vec *to,void *user)

{
  FT_Memory memory;
  SDF_Contour *pSStack_28;
  FT_Error error;
  SDF_Contour *contour;
  SDF_Shape *shape;
  void *user_local;
  FT_26D6_Vec *to_local;
  
  pSStack_28 = (SDF_Contour *)0x0;
  if ((to == (FT_26D6_Vec *)0x0) || (user == (void *)0x0)) {
    memory._4_4_ = 6;
  }
  else {
    contour = (SDF_Contour *)user;
    shape = (SDF_Shape *)user;
    user_local = to;
    memory._4_4_ = sdf_contour_new(*user,&stack0xffffffffffffffd8);
    if (memory._4_4_ == 0) {
      (pSStack_28->last_pos).x = *user_local;
      (pSStack_28->last_pos).y = *(FT_Pos *)((long)user_local + 8);
      pSStack_28->next = (SDF_Contour_ *)(contour->last_pos).y;
      (contour->last_pos).y = (FT_Pos)pSStack_28;
    }
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  sdf_move_to( const FT_26D6_Vec* to,
               void*              user )
  {
    SDF_Shape*    shape   = ( SDF_Shape* )user;
    SDF_Contour*  contour = NULL;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = shape->memory;


    if ( !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_CALL( sdf_contour_new( memory, &contour ) );

    contour->last_pos = *to;
    contour->next     = shape->contours;
    shape->contours   = contour;

  Exit:
    return error;
  }